

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_motion.c
# Opt level: O1

void fsnav_ins_motion_euler(void)

{
  double dVar1;
  fsnav_imu *pfVar2;
  double dVar3;
  bool bVar4;
  fsnav_struct *pfVar5;
  long lVar6;
  undefined1 *puVar7;
  double *b;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  char alt_token [4];
  char lat_token [4];
  char lon_token [4];
  double dvrel [3];
  double alt_range [2];
  double lat_range [2];
  double lon_range [2];
  double C_2 [9];
  double dvcor [3];
  char local_e4 [12];
  double local_d8 [4];
  double local_b8;
  double local_b0;
  double local_a8 [7];
  undefined1 local_70 [72];
  double local_28 [3];
  
  dVar13 = fsnav_ins_motion_euler::t0;
  builtin_strncpy(local_e4 + 8,"lon",4);
  builtin_strncpy(local_e4 + 4,"lat",4);
  builtin_strncpy(local_e4,"alt",4);
  local_a8[4] = -180.0;
  local_a8[5] = 180.0;
  local_a8[2] = -90.0;
  local_a8[3] = 90.0;
  local_a8[0] = -20000.0;
  local_a8[1] = 50000.0;
  pfVar2 = fsnav->imu;
  if (pfVar2 != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      (pfVar2->sol).v_valid = '\0';
      (pfVar2->sol).llh_valid = '\0';
      dVar13 = fsnav_ins_motion_parse_double
                         (local_e4 + 8,pfVar2->cfg,pfVar2->cfglength,local_a8 + 4,0.0);
      pfVar2 = fsnav->imu;
      (pfVar2->sol).llh[0] = dVar13 / (fsnav->imu_const).rad2deg;
      dVar13 = fsnav_ins_motion_parse_double
                         (local_e4 + 4,pfVar2->cfg,pfVar2->cfglength,local_a8 + 2,0.0);
      pfVar2 = fsnav->imu;
      (pfVar2->sol).llh[1] = dVar13 / (fsnav->imu_const).rad2deg;
      dVar13 = fsnav_ins_motion_parse_double(local_e4,pfVar2->cfg,pfVar2->cfglength,local_a8,0.0);
      pfVar2 = fsnav->imu;
      (pfVar2->sol).llh[2] = dVar13;
      (pfVar2->sol).llh_valid = '\x01';
      (pfVar2->sol).v[0] = 0.0;
      (pfVar2->sol).v[1] = 0.0;
      (pfVar2->sol).v[2] = 0.0;
      (pfVar2->sol).v_valid = '\x01';
      fsnav_ins_motion_euler::t0 = -1.0;
    }
    else if ((((-1 < fsnav->mode) && ((pfVar2->sol).v_valid != '\0')) &&
             ((pfVar2->sol).llh_valid != '\0')) &&
            ((((pfVar2->sol).L_valid != '\0' && (pfVar2->f_valid != '\0')) &&
             ((pfVar2->g_valid != '\0' &&
              (dVar11 = pfVar2->t, bVar4 = 0.0 <= fsnav_ins_motion_euler::t0,
              fsnav_ins_motion_euler::t0 = dVar11, bVar4)))))) {
      local_b0 = sin((pfVar2->sol).llh[1]);
      dVar3 = cos((fsnav->imu->sol).llh[1]);
      pfVar5 = fsnav;
      dVar10 = (fsnav->imu_const).e2;
      dVar12 = local_b0 * dVar10 * local_b0;
      dVar14 = dVar12 * dVar12;
      local_d8[3] = (dVar14 * 3.0 * 0.125 + dVar12 * 0.5 + 1.0) * (fsnav->imu_const).a;
      pfVar2 = fsnav->imu;
      dVar1 = (pfVar2->sol).llh[2];
      dVar9 = (pfVar2->sol).v[0];
      local_b8 = (dVar14 * dVar12 + dVar12 + 1.0 + dVar14) * (1.0 - dVar10) * local_d8[3] + dVar1;
      local_d8[3] = local_d8[3] + dVar1;
      (pfVar2->sol).llh_valid = '\0';
      (pfVar2->sol).v_valid = '\0';
      local_d8[0] = -(pfVar2->sol).v[1] / local_b8;
      pfVar2->W[0] = local_d8[0];
      dVar9 = dVar9 / local_d8[3];
      pfVar2->W[1] = dVar9;
      if (0.00390625 <= dVar3) {
        dVar10 = (dVar9 * local_b0) / dVar3;
      }
      else {
        dVar10 = 0.0;
      }
      pfVar2->W[2] = dVar10;
      pfVar2->W_valid = 0.00390625 <= dVar3;
      dVar11 = dVar11 - dVar13;
      dVar13 = (pfVar5->imu_const).u;
      dVar13 = dVar13 + dVar13;
      local_d8[1] = dVar13 * dVar3 + pfVar2->W[1];
      local_d8[2] = dVar13 * local_b0 + pfVar2->W[2];
      fsnav_linal_cross3x1(local_28,(pfVar2->sol).v,local_d8);
      pfVar2 = fsnav->imu;
      if (pfVar2->w_valid == '\0') {
        b = pfVar2->f;
      }
      else {
        lVar6 = 0;
        do {
          local_d8[lVar6] = pfVar2->w[lVar6] * dVar11 * 0.5;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        fsnav_linal_eul2mat(local_a8 + 6,local_d8);
        pfVar2 = fsnav->imu;
        puVar7 = local_70;
        lVar6 = 0;
        do {
          dVar13 = *(double *)(local_70 + lVar6 * 0x18 + -8) * pfVar2->f[0];
          *(double *)(local_70 + lVar6 * 8 + -8) = dVar13;
          lVar8 = 0;
          do {
            dVar13 = dVar13 + *(double *)(puVar7 + lVar8 * 8) * pfVar2->f[lVar8 + 1];
            *(double *)(local_70 + lVar6 * 8 + -8) = dVar13;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 2);
          lVar6 = lVar6 + 1;
          puVar7 = puVar7 + 0x18;
        } while (lVar6 != 3);
        pfVar2 = fsnav->imu;
        b = local_a8 + 6;
      }
      fsnav_linal_mmul1T(local_d8,(pfVar2->sol).L,b,3,3,1);
      pfVar2 = fsnav->imu;
      lVar6 = 0;
      do {
        (pfVar2->sol).v[lVar6] =
             (local_28[lVar6] + local_d8[lVar6] + pfVar2->g[lVar6]) * dVar11 +
             (pfVar2->sol).v[lVar6];
        pfVar5 = fsnav;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      pfVar2 = fsnav->imu;
      (pfVar2->sol).v_valid = '\x01';
      if (dVar3 < 0.00390625) {
        (pfVar2->sol).llh[2] = dVar11 * (pfVar2->sol).v[2] + (pfVar2->sol).llh[2];
        (pfVar2->sol).llh_valid = '\0';
      }
      else {
        dVar13 = (pfVar2->sol).v[1];
        (pfVar2->sol).llh[0] =
             ((pfVar2->sol).v[0] / (dVar3 * local_d8[3])) * dVar11 + (pfVar2->sol).llh[0];
        dVar10 = (dVar13 / local_b8) * dVar11 + (pfVar2->sol).llh[1];
        (pfVar2->sol).llh[1] = dVar10;
        (pfVar2->sol).llh[2] = dVar11 * (pfVar2->sol).v[2] + (pfVar2->sol).llh[2];
        dVar13 = (pfVar5->imu_const).pi;
        if (dVar10 < dVar13 * -0.5) {
          (pfVar2->sol).llh[1] = -dVar13 - dVar10;
          fsnav_ins_motion_flip_sol_over_pole(&pfVar2->sol);
        }
        pfVar2 = fsnav->imu;
        dVar13 = (pfVar2->sol).llh[1];
        dVar11 = (fsnav->imu_const).pi;
        if (dVar11 * 0.5 < dVar13) {
          (pfVar2->sol).llh[1] = dVar11 - dVar13;
          fsnav_ins_motion_flip_sol_over_pole(&pfVar2->sol);
        }
        pfVar5 = fsnav;
        pfVar2 = fsnav->imu;
        dVar13 = (pfVar2->sol).llh[0];
        dVar11 = (fsnav->imu_const).pi;
        if (dVar13 < -dVar11) {
          do {
            dVar13 = dVar13 + dVar11 + dVar11;
            (pfVar2->sol).llh[0] = dVar13;
            dVar11 = (pfVar5->imu_const).pi;
          } while (dVar13 < -dVar11);
        }
        dVar13 = (pfVar2->sol).llh[0];
        while (dVar11 = (pfVar5->imu_const).pi, dVar11 < dVar13) {
          dVar13 = dVar13 - (dVar11 + dVar11);
          (pfVar2->sol).llh[0] = dVar13;
        }
        (pfVar2->sol).llh_valid = '\x01';
      }
    }
  }
  return;
}

Assistant:

void fsnav_ins_motion_euler(void) {

	const char 
		lon_token[] = "lon",        // starting longitude parameter name in configuration
		lat_token[] = "lat",        // starting latitude  parameter name in configuration
		alt_token[] = "alt";        // starting altitude  parameter name in configuration

	const double 
		lon_range[] = {-180, +180},	// longitude range, 0 by default
		lat_range[] = { -90,  +90},	// latitude  range, 0 by default
		alt_range[] = {-20e3,50e3},	// altitude  range, 0 by default
		eps = 1.0/0x0100;			// 2^-8, guaranteed non-zero value in IEEE754 half-precision format

	static double t0  = -1;         // previous time

	double dt;                      // time step
	double
		sphi, cphi,	                // sine and cosine of latitude
		Rn_h, Re_h,	                // south-to-north and east-to-west curvature radii, altitude-adjusted
		e2s2, e4s4,	                // e^2*sin(phi)^2, (e^2*sin(phi)^2)^2
		dvrel[3],	                // proper acceleration in navigation frame
		dvcor[3],	                // Coriolis acceleration in navigation frame
		C_2[9];                     // intermediate matrix/vector for modified Euler component
	size_t i, j;                    // common index variables


	// check if imu data has been initialized
	if (fsnav->imu == NULL)
		return;

	if (fsnav->mode == 0) {		// init

		// drop validity flags
		fsnav->imu->sol.  v_valid = 0;
		fsnav->imu->sol.llh_valid = 0;		
		// parse parameters from configuration	
		fsnav->imu->sol.llh[0] = // starting longitude
			fsnav_ins_motion_parse_double(lon_token, fsnav->imu->cfg,fsnav->imu->cfglength, (double *)lon_range,0)
			/fsnav->imu_const.rad2deg; // degrees to radians
		fsnav->imu->sol.llh[1] = // starting latitude
			fsnav_ins_motion_parse_double(lat_token, fsnav->imu->cfg,fsnav->imu->cfglength, (double *)lat_range,0)
			/fsnav->imu_const.rad2deg; // degrees to radians
		fsnav->imu->sol.llh[2] = // starting altitude
			fsnav_ins_motion_parse_double(alt_token, fsnav->imu->cfg,fsnav->imu->cfglength, (double *)alt_range,0);
		// raise coordinates validity flag
		fsnav->imu->sol.llh_valid = 1;
		// zero velocity at start
		for (i = 0; i < 3; i++)
			fsnav->imu->sol.v[i] = 0;
		fsnav->imu->sol.v_valid = 1;
		// reset previous time
		t0 = -1;

	}

	else if (fsnav->mode < 0) {	// termination
		// do nothing
	}

	else						// main cycle
	{
		// check for crucial data initialized
		if (   !fsnav->imu->sol.  v_valid 
			|| !fsnav->imu->sol.llh_valid 
			|| !fsnav->imu->sol.  L_valid 
			|| !fsnav->imu->f_valid 
			|| !fsnav->imu->g_valid)
			return;
		// time variables
		if (t0 < 0) { // first touch
			t0 = fsnav->imu->t;
			return;
		}
		dt = fsnav->imu->t - t0;
		t0 = fsnav->imu->t;
		// ellipsoid geometry
		sphi = sin(fsnav->imu->sol.llh[1]);
		cphi = cos(fsnav->imu->sol.llh[1]);
		e2s2 = fsnav->imu_const.e2*sphi*sphi;
		e4s4 = e2s2*e2s2;					
		Re_h = fsnav->imu_const.a*(1 + e2s2/2 + 3*e4s4/8);	                                        // Taylor expansion within 0.5 m, not altitude-adjusted
		Rn_h = Re_h*(1 - fsnav->imu_const.e2)*(1 + e2s2 + e4s4 + e2s2*e4s4) + fsnav->imu->sol.llh[2]; // Taylor expansion within 0.5 m
		Re_h += fsnav->imu->sol.llh[2];						                                        // adjust for altitude
		// drop validity flags
		fsnav->imu->W_valid       = 0;
		fsnav->imu->sol.llh_valid = 0;
		fsnav->imu->sol.  v_valid = 0;
		// angular rate of navigation frame relative to the Earth
		fsnav->imu->W[0] = -fsnav->imu->sol.v[1]/Rn_h;
		fsnav->imu->W[1] =  fsnav->imu->sol.v[0]/Re_h;	
		if (cphi < eps) { // check for Earth pole proximity
			fsnav->imu->W[2] = 0;    // freeze
			fsnav->imu->W_valid = 0; // drop validity
		}
		else {
			fsnav->imu->W[2] = fsnav->imu->sol.v[0]/Re_h*sphi/cphi;
			fsnav->imu->W_valid = 1;
		}
		// velocity
			// Coriolis acceleration
		dvrel[0] = fsnav->imu->W[0];
		dvrel[1] = fsnav->imu->W[1] + 2*fsnav->imu_const.u*cphi;
		dvrel[2] = fsnav->imu->W[2] + 2*fsnav->imu_const.u*sphi;
		fsnav_linal_cross3x1(dvcor, fsnav->imu->sol.v, dvrel);
			// proper acceleration
		if (fsnav->imu->w_valid) { // if able to calculate attitude mid-point using gyroscopes
			for (i = 0; i < 3; i++)
				dvrel[i] = fsnav->imu->w[i]*dt/2; // midpoint rotation Euler vector
			fsnav_linal_eul2mat(C_2, dvrel); // midpoint attitude matrix factor
			for (i = 0; i < 3; i++) // multiply C_2*f, store in the first row of C_2
				for (j = 1, C_2[i] = C_2[i*3]*fsnav->imu->f[0]; j < 3; j++)
					C_2[i] += C_2[i*3+j]*fsnav->imu->f[j];
			fsnav_linal_mmul1T(dvrel, fsnav->imu->sol.L, C_2, 3, 3, 1); // dvrel = L^T(t+dt)*C_2(w*dt/2)*f
		}
		else // otherwise, go on with only the current attitude matrix
			fsnav_linal_mmul1T(dvrel, fsnav->imu->sol.L, fsnav->imu->f, 3, 3, 1);
			// velocity update
		for (i = 0; i < 3; i++)
			fsnav->imu->sol.v[i] += (dvcor[i] + dvrel[i] + fsnav->imu->g[i])*dt;
		fsnav->imu->sol.v_valid = 1;
		// coordinates
		if (cphi < eps) { // check for Earth pole proximity
			fsnav->imu->sol.llh[2] += fsnav->imu->sol.v[2]				*dt;
			fsnav->imu->sol.llh_valid = 0; // drop validity
		}
		else {
			fsnav->imu->sol.llh[0] += fsnav->imu->sol.v[0]/(Re_h*cphi)	*dt;
			fsnav->imu->sol.llh[1] += fsnav->imu->sol.v[1]/ Rn_h			*dt;
			fsnav->imu->sol.llh[2] += fsnav->imu->sol.v[2]				*dt;
			// flip latitude if crossed a pole
			if (fsnav->imu->sol.llh[1] < -fsnav->imu_const.pi/2) { // South pole
				fsnav->imu->sol.llh[1] = -fsnav->imu_const.pi - fsnav->imu->sol.llh[1];
				fsnav_ins_motion_flip_sol_over_pole(&(fsnav->imu->sol));			
			}
			if (fsnav->imu->sol.llh[1] > +fsnav->imu_const.pi/2) { // North pole
				fsnav->imu->sol.llh[1] = +fsnav->imu_const.pi - fsnav->imu->sol.llh[1];
				fsnav_ins_motion_flip_sol_over_pole(&(fsnav->imu->sol));			
			}
			// adjust longitude into range
			while (fsnav->imu->sol.llh[0] < -fsnav->imu_const.pi)
				fsnav->imu->sol.llh[0] += 2*fsnav->imu_const.pi;
			while (fsnav->imu->sol.llh[0] > +fsnav->imu_const.pi)
				fsnav->imu->sol.llh[0] -= 2*fsnav->imu_const.pi;
			fsnav->imu->sol.llh_valid = 1;
		}
	}

}